

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O2

void WebPConvertRGBA32ToUV_C(uint16_t *rgb,uint8_t *u,uint8_t *v,int width)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  uVar4 = (ulong)(uint)width;
  if (width < 1) {
    uVar4 = 0;
  }
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    uVar1 = rgb[uVar5 * 4];
    uVar2 = rgb[uVar5 * 4 + 1];
    uVar3 = rgb[uVar5 * 4 + 2];
    iVar6 = (int)((uint)uVar3 * 0x7080 + 0x2020000 + (uint)uVar2 * -0x4a89 + (uint)uVar1 * -0x25f7)
            >> 0x12;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    u[uVar5] = (uint8_t)iVar6;
    iVar6 = (int)((uint)uVar3 * -0x124c + 0x2020000 + (uint)uVar2 * -0x5e34 + (uint)uVar1 * 0x7080)
            >> 0x12;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    v[uVar5] = (uint8_t)iVar6;
  }
  return;
}

Assistant:

void WebPConvertRGBA32ToUV_C(const uint16_t* rgb,
                             uint8_t* u, uint8_t* v, int width) {
  int i;
  for (i = 0; i < width; i += 1, rgb += 4) {
    const int r = rgb[0], g = rgb[1], b = rgb[2];
    u[i] = VP8RGBToU(r, g, b, YUV_HALF << 2);
    v[i] = VP8RGBToV(r, g, b, YUV_HALF << 2);
  }
}